

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditSeedBuilderTests.cpp
# Opt level: O0

IterateResult __thiscall
dit::anon_unknown_1::SeedBuilderTest<unsigned_short>::iterate(SeedBuilderTest<unsigned_short> *this)

{
  deUint32 dVar1;
  MessageBuilder *pMVar2;
  deUint32 local_4b4;
  MessageBuilder local_4b0;
  MessageBuilder local_330;
  MessageBuilder local_1a0;
  SeedBuilder local_1c;
  TestLog *pTStack_18;
  SeedBuilder builder;
  TestLog *log;
  SeedBuilderTest<unsigned_short> *this_local;
  
  pTStack_18 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  tcu::SeedBuilder::SeedBuilder(&local_1c);
  tcu::operator<<(&local_1c,this->m_value);
  tcu::TestLog::operator<<(&local_1a0,pTStack_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [8])"Value: ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&this->m_value);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  tcu::TestLog::operator<<(&local_330,pTStack_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_330,(char (*) [16])"Expected seed: ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&this->m_seed);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_330);
  tcu::TestLog::operator<<(&local_4b0,pTStack_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_4b0,(char (*) [11])"Got seed: ");
  local_4b4 = tcu::SeedBuilder::get(&local_1c);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_4b4);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_4b0);
  dVar1 = tcu::SeedBuilder::get(&local_1c);
  if (dVar1 == this->m_seed) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Got invalid seed");
  }
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		TestLog&			log		= m_testCtx.getLog();
		tcu::SeedBuilder	builder;

		builder << m_value;

		log << TestLog::Message << "Value: " << m_value << TestLog::EndMessage;
		log << TestLog::Message << "Expected seed: " << m_seed << TestLog::EndMessage;
		log << TestLog::Message << "Got seed: " << builder.get() << TestLog::EndMessage;

		if (builder.get() != m_seed)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid seed");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}